

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *this;
  ostream *poVar1;
  int i;
  int iVar2;
  allocator<char> local_7d;
  int x_1;
  int m;
  int n;
  priority_queue<int,_std::less<int>_> pq;
  int x;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105170) = 0;
  pq.mData = (int *)operator_new__(4);
  *pq.mData = 0;
  pq.mCap = 1;
  pq.mSize = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
  std::istream::operator>>(this,&m);
  for (iVar2 = 0; iVar2 < n; iVar2 = iVar2 + 1) {
    std::istream::operator>>((istream *)&std::cin,&x);
    CP::priority_queue<int,_std::less<int>_>::push(&pq,&x);
  }
  for (iVar2 = 0; iVar2 < m; iVar2 = iVar2 + 1) {
    std::istream::operator>>((istream *)&std::cin,&x_1);
    CP::priority_queue<int,_std::less<int>_>::get_rank(&pq,(long)x_1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__cxx11::string::string<std::allocator<char>>((string *)&x,"\n",&local_7d);
    std::operator<<(poVar1,(string *)&x);
    std::__cxx11::string::~string((string *)&x);
  }
  CP::priority_queue<int,_std::less<int>_>::~priority_queue(&pq);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(0);

  CP::priority_queue<int> pq;
  int n,m;
  std::cin >> n >> m;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    pq.push(x);
  }

  for (int i = 0;i < m;i++) {
    int x;
    std::cin >> x;
    std::cout << pq.get_rank(x) << std::endl;
  }
  
}